

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppModel.cpp
# Opt level: O3

string * __thiscall hiberlite::Scope::full_abi_cxx11_(string *__return_storage_ptr__,Scope *this)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_88;
  long local_80;
  ulong local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar2 = (this->_prefix)._M_dataplus._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + (this->_prefix)._M_string_length);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_80 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->_table)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->_table)._M_string_length);
    return __return_storage_ptr__;
  }
  pcVar2 = (this->_table)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + (this->_table)._M_string_length);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_48);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_78 = *puVar6;
    uStack_70 = (undefined4)plVar4[3];
    uStack_6c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar6;
    local_88 = (ulong *)*plVar4;
  }
  local_80 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar2 = (this->_prefix)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + (this->_prefix)._M_string_length);
  uVar7 = 0xf;
  if (local_88 != &local_78) {
    uVar7 = local_78;
  }
  if (uVar7 < (ulong)(local_60 + local_80)) {
    uVar7 = 0xf;
    if (local_68 != local_58) {
      uVar7 = local_58[0];
    }
    if ((ulong)(local_60 + local_80) <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_00116fcc;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_00116fcc:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Scope::full()
{
	if(prefix().size())
		return table()+"_"+prefix();
	else
		return table();
}